

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::PatternMap::getPatternFromSkeleton
          (PatternMap *this,PtnSkeleton *skeleton,PtnSkeleton **specifiedSkeletonPtr)

{
  char cVar1;
  PtnSkeleton *pPVar2;
  int iVar3;
  PtnElem *pPVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (specifiedSkeletonPtr != (PtnSkeleton **)0x0) {
    *specifiedSkeletonPtr = (PtnSkeleton *)0x0;
  }
  lVar5 = -0x10;
  while (*(UBool *)((long)(&skeleton->baseOriginal + 1) + lVar5) == '\0') {
    lVar5 = lVar5 + 1;
    if (lVar5 == 0) {
      return (UnicodeString *)0x0;
    }
  }
  iVar3 = -0x47;
  cVar1 = (skeleton->baseOriginal).lengths[lVar5];
  if ((ushort)((short)cVar1 - 0x41U) < 0x1a) {
    iVar3 = -0x41;
  }
  else if (0x19 < (ushort)((short)cVar1 - 0x61U)) {
    return (UnicodeString *)0x0;
  }
  pPVar4 = this->boot[iVar3 + ((int)cVar1 & 0xffffU)];
  do {
    if (pPVar4 == (PtnElem *)0x0) {
      return (UnicodeString *)0x0;
    }
    pPVar2 = (pPVar4->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
    if (specifiedSkeletonPtr == (PtnSkeleton **)0x0) {
      auVar8[0] = -((skeleton->baseOriginal).chars[0] == (pPVar2->baseOriginal).chars[0]);
      auVar8[1] = -((skeleton->baseOriginal).chars[1] == (pPVar2->baseOriginal).chars[1]);
      auVar8[2] = -((skeleton->baseOriginal).chars[2] == (pPVar2->baseOriginal).chars[2]);
      auVar8[3] = -((skeleton->baseOriginal).chars[3] == (pPVar2->baseOriginal).chars[3]);
      auVar8[4] = -((skeleton->baseOriginal).chars[4] == (pPVar2->baseOriginal).chars[4]);
      auVar8[5] = -((skeleton->baseOriginal).chars[5] == (pPVar2->baseOriginal).chars[5]);
      auVar8[6] = -((skeleton->baseOriginal).chars[6] == (pPVar2->baseOriginal).chars[6]);
      auVar8[7] = -((skeleton->baseOriginal).chars[7] == (pPVar2->baseOriginal).chars[7]);
      auVar8[8] = -((skeleton->baseOriginal).chars[8] == (pPVar2->baseOriginal).chars[8]);
      auVar8[9] = -((skeleton->baseOriginal).chars[9] == (pPVar2->baseOriginal).chars[9]);
      auVar8[10] = -((skeleton->baseOriginal).chars[10] == (pPVar2->baseOriginal).chars[10]);
      auVar8[0xb] = -((skeleton->baseOriginal).chars[0xb] == (pPVar2->baseOriginal).chars[0xb]);
      auVar8[0xc] = -((skeleton->baseOriginal).chars[0xc] == (pPVar2->baseOriginal).chars[0xc]);
      auVar8[0xd] = -((skeleton->baseOriginal).chars[0xd] == (pPVar2->baseOriginal).chars[0xd]);
      auVar8[0xe] = -((skeleton->baseOriginal).chars[0xe] == (pPVar2->baseOriginal).chars[0xe]);
      auVar8[0xf] = -((skeleton->baseOriginal).chars[0xf] == (pPVar2->baseOriginal).chars[0xf]);
      if (((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff) &&
         (auVar9[0] = -((skeleton->baseOriginal).lengths[0] == (pPVar2->baseOriginal).lengths[0]),
         auVar9[1] = -((skeleton->baseOriginal).lengths[1] == (pPVar2->baseOriginal).lengths[1]),
         auVar9[2] = -((skeleton->baseOriginal).lengths[2] == (pPVar2->baseOriginal).lengths[2]),
         auVar9[3] = -((skeleton->baseOriginal).lengths[3] == (pPVar2->baseOriginal).lengths[3]),
         auVar9[4] = -((skeleton->baseOriginal).lengths[4] == (pPVar2->baseOriginal).lengths[4]),
         auVar9[5] = -((skeleton->baseOriginal).lengths[5] == (pPVar2->baseOriginal).lengths[5]),
         auVar9[6] = -((skeleton->baseOriginal).lengths[6] == (pPVar2->baseOriginal).lengths[6]),
         auVar9[7] = -((skeleton->baseOriginal).lengths[7] == (pPVar2->baseOriginal).lengths[7]),
         auVar9[8] = -((skeleton->baseOriginal).lengths[8] == (pPVar2->baseOriginal).lengths[8]),
         auVar9[9] = -((skeleton->baseOriginal).lengths[9] == (pPVar2->baseOriginal).lengths[9]),
         auVar9[10] = -((skeleton->baseOriginal).lengths[10] == (pPVar2->baseOriginal).lengths[10]),
         auVar9[0xb] = -((skeleton->baseOriginal).lengths[0xb] ==
                        (pPVar2->baseOriginal).lengths[0xb]),
         auVar9[0xc] = -((skeleton->baseOriginal).lengths[0xc] ==
                        (pPVar2->baseOriginal).lengths[0xc]),
         auVar9[0xd] = -((skeleton->baseOriginal).lengths[0xd] ==
                        (pPVar2->baseOriginal).lengths[0xd]),
         auVar9[0xe] = -((skeleton->baseOriginal).lengths[0xe] ==
                        (pPVar2->baseOriginal).lengths[0xe]),
         auVar9[0xf] = -((skeleton->baseOriginal).lengths[0xf] ==
                        (pPVar2->baseOriginal).lengths[0xf]),
         (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
         == 0xffff)) goto LAB_002e8e60;
    }
    else {
      auVar6[0] = -((skeleton->original).chars[0] == (pPVar2->original).chars[0]);
      auVar6[1] = -((skeleton->original).chars[1] == (pPVar2->original).chars[1]);
      auVar6[2] = -((skeleton->original).chars[2] == (pPVar2->original).chars[2]);
      auVar6[3] = -((skeleton->original).chars[3] == (pPVar2->original).chars[3]);
      auVar6[4] = -((skeleton->original).chars[4] == (pPVar2->original).chars[4]);
      auVar6[5] = -((skeleton->original).chars[5] == (pPVar2->original).chars[5]);
      auVar6[6] = -((skeleton->original).chars[6] == (pPVar2->original).chars[6]);
      auVar6[7] = -((skeleton->original).chars[7] == (pPVar2->original).chars[7]);
      auVar6[8] = -((skeleton->original).chars[8] == (pPVar2->original).chars[8]);
      auVar6[9] = -((skeleton->original).chars[9] == (pPVar2->original).chars[9]);
      auVar6[10] = -((skeleton->original).chars[10] == (pPVar2->original).chars[10]);
      auVar6[0xb] = -((skeleton->original).chars[0xb] == (pPVar2->original).chars[0xb]);
      auVar6[0xc] = -((skeleton->original).chars[0xc] == (pPVar2->original).chars[0xc]);
      auVar6[0xd] = -((skeleton->original).chars[0xd] == (pPVar2->original).chars[0xd]);
      auVar6[0xe] = -((skeleton->original).chars[0xe] == (pPVar2->original).chars[0xe]);
      auVar6[0xf] = -((skeleton->original).chars[0xf] == (pPVar2->original).chars[0xf]);
      if (((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff) &&
         (auVar7[0] = -((skeleton->original).lengths[0] == (pPVar2->original).lengths[0]),
         auVar7[1] = -((skeleton->original).lengths[1] == (pPVar2->original).lengths[1]),
         auVar7[2] = -((skeleton->original).lengths[2] == (pPVar2->original).lengths[2]),
         auVar7[3] = -((skeleton->original).lengths[3] == (pPVar2->original).lengths[3]),
         auVar7[4] = -((skeleton->original).lengths[4] == (pPVar2->original).lengths[4]),
         auVar7[5] = -((skeleton->original).lengths[5] == (pPVar2->original).lengths[5]),
         auVar7[6] = -((skeleton->original).lengths[6] == (pPVar2->original).lengths[6]),
         auVar7[7] = -((skeleton->original).lengths[7] == (pPVar2->original).lengths[7]),
         auVar7[8] = -((skeleton->original).lengths[8] == (pPVar2->original).lengths[8]),
         auVar7[9] = -((skeleton->original).lengths[9] == (pPVar2->original).lengths[9]),
         auVar7[10] = -((skeleton->original).lengths[10] == (pPVar2->original).lengths[10]),
         auVar7[0xb] = -((skeleton->original).lengths[0xb] == (pPVar2->original).lengths[0xb]),
         auVar7[0xc] = -((skeleton->original).lengths[0xc] == (pPVar2->original).lengths[0xc]),
         auVar7[0xd] = -((skeleton->original).lengths[0xd] == (pPVar2->original).lengths[0xd]),
         auVar7[0xe] = -((skeleton->original).lengths[0xe] == (pPVar2->original).lengths[0xe]),
         auVar7[0xf] = -((skeleton->original).lengths[0xf] == (pPVar2->original).lengths[0xf]),
         (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
         == 0xffff)) {
        if (pPVar4->skeletonWasSpecified != '\0') {
          *specifiedSkeletonPtr = pPVar2;
        }
LAB_002e8e60:
        return &pPVar4->pattern;
      }
    }
    pPVar4 = (pPVar4->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
  } while( true );
}

Assistant:

const UnicodeString *
PatternMap::getPatternFromSkeleton(const PtnSkeleton& skeleton, const PtnSkeleton** specifiedSkeletonPtr) const { // key to search for
   PtnElem *curElem;

   if (specifiedSkeletonPtr) {
       *specifiedSkeletonPtr = nullptr;
   }

   // find boot entry
   UChar baseChar = skeleton.getFirstChar();
   if ((curElem=getHeader(baseChar))==nullptr) {
       return nullptr;  // no match
   }

   do  {
       UBool equal;
       if (specifiedSkeletonPtr != nullptr) { // called from DateTimePatternGenerator::getBestRaw or addPattern, use original
           equal = curElem->skeleton->original == skeleton.original;
       } else { // called from DateTimePatternGenerator::getRedundants, use baseOriginal
           equal = curElem->skeleton->baseOriginal == skeleton.baseOriginal;
       }
       if (equal) {
           if (specifiedSkeletonPtr && curElem->skeletonWasSpecified) {
               *specifiedSkeletonPtr = curElem->skeleton.getAlias();
           }
           return &(curElem->pattern);
       }
       curElem = curElem->next.getAlias();
   } while (curElem != nullptr);

   return nullptr;
}